

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

uint256 * __thiscall
node::anon_unknown_2::ChainImpl::getBlockHash
          (uint256 *__return_storage_ptr__,ChainImpl *this,int height)

{
  ChainstateManager *this_00;
  Chainstate *pCVar1;
  CBlockIndex **ppCVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  CBlockIndex *local_38;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
             ,0x224,false);
  this_00 = chainman(this);
  pCVar1 = ChainstateManager::ActiveChainstate(this_00);
  local_38 = CChain::operator[](&pCVar1->m_chain,height);
  ppCVar2 = inline_assertion_check<true,CBlockIndex*>
                      (&local_38,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                       ,0x225,"getBlockHash","chainman().ActiveChain()[height]");
  CBlockIndex::GetBlockHash(__return_storage_ptr__,*ppCVar2);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 getBlockHash(int height) override
    {
        LOCK(::cs_main);
        return Assert(chainman().ActiveChain()[height])->GetBlockHash();
    }